

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void ps_lattice_pushq(ps_lattice_t *dag,ps_latlink_t *link)

{
  latlink_list_t *plVar1;
  ps_latlink_t *link_local;
  ps_lattice_t *dag_local;
  
  if (dag->q_head == (latlink_list_t *)0x0) {
    plVar1 = latlink_list_new(dag,link,(latlink_list_t *)0x0);
    dag->q_tail = plVar1;
    dag->q_head = plVar1;
  }
  else {
    plVar1 = latlink_list_new(dag,link,(latlink_list_t *)0x0);
    dag->q_tail->next = plVar1;
    dag->q_tail = dag->q_tail->next;
  }
  return;
}

Assistant:

void
ps_lattice_pushq(ps_lattice_t *dag, ps_latlink_t *link)
{
    if (dag->q_head == NULL)
        dag->q_head = dag->q_tail = latlink_list_new(dag, link, NULL);
    else {
        dag->q_tail->next = latlink_list_new(dag, link, NULL);
        dag->q_tail = dag->q_tail->next;
    }

}